

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode
JsParse(JsValueRef scriptVal,JsSourceContext sourceContext,JsValueRef sourceUrl,
       JsParseScriptAttributes parseAttributes,JsValueRef *result)

{
  anon_class_48_6_2009d855 fn;
  bool bVar1;
  uint uVar2;
  JsErrorCode JVar3;
  LoadScriptFlag loadScriptFlag;
  WCHAR **in_stack_ffffffffffffff68;
  JsValueRef local_60;
  WCHAR *local_58;
  WCHAR *url;
  byte *local_48;
  byte *script;
  size_t cb;
  bool isString;
  
  JVar3 = JsErrorNullArgument;
  if (sourceUrl != (JsValueRef)0x0 && scriptVal != (JsValueRef)0x0) {
    local_60 = sourceUrl;
    url = (WCHAR *)scriptVal;
    bVar1 = Js::VarIs<Js::ArrayBuffer>(scriptVal);
    cb._7_1_ = 0;
    if (bVar1) {
      local_48 = (byte *)(**(code **)(*scriptVal + 0x390))(scriptVal);
      uVar2 = (**(code **)(*scriptVal + 0x388))(scriptVal);
      script = (byte *)(ulong)uVar2;
      loadScriptFlag =
           ((parseAttributes & JsParseScriptAttributeArrayBufferIsUtf16Encoded) ==
            JsParseScriptAttributeNone | 4) << 6;
    }
    else {
      cb._7_1_ = Js::VarIs<Js::JavascriptString>(scriptVal);
      loadScriptFlag = LoadScriptFlag_None;
      if (!(bool)cb._7_1_) {
        return JsErrorInvalidArgument;
      }
    }
    fn.scriptVal._0_1_ = (char)&local_48;
    fn.isString = (bool *)&url;
    fn.scriptVal._1_7_ = (int7)((ulong)&local_48 >> 8);
    fn.script._0_4_ = (int)&script;
    fn.script._4_4_ = (int)((ulong)&script >> 0x20);
    fn.cb._0_1_ = (char)&local_60;
    fn.cb._1_7_ = (int7)((ulong)&local_60 >> 8);
    fn.sourceUrl = &local_58;
    fn.url = in_stack_ffffffffffffff68;
    JVar3 = GlobalAPIWrapper_NoRecord<CompileRun(void*,unsigned_long,void*,_JsParseScriptAttributes,void**,bool)::__0>
                      (fn);
    if (JVar3 == JsNoError) {
      JVar3 = RunScriptCore(url,local_48,(size_t)script,loadScriptFlag,sourceContext,local_58,true,
                            parseAttributes,false,result);
    }
  }
  return JVar3;
}

Assistant:

CHAKRA_API JsParse(
    _In_ JsValueRef scriptVal,
    _In_ JsSourceContext sourceContext,
    _In_ JsValueRef sourceUrl,
    _In_ JsParseScriptAttributes parseAttributes,
    _Out_ JsValueRef *result)
{
    return CompileRun(scriptVal, sourceContext, sourceUrl, parseAttributes,
        result, true);
}